

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_d3d_light.cxx
# Opt level: O1

void __thiscall xray_re::d3d_light::save(d3d_light *this,xr_writer *w)

{
  float local_1c;
  
  local_1c = (float)this->type;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->diffuse).r;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->diffuse).g;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->diffuse).b;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->diffuse).a;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->specular).r;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->specular).g;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->specular).b;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->specular).a;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->ambient).r;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->ambient).g;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->ambient).b;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (this->ambient).a;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->range;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->falloff;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->attenuation0;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->attenuation1;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->attenuation2;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->theta;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->phi;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  return;
}

Assistant:

void d3d_light::save(xr_writer& w) const
{
	w.w_u32(type);
	w.w_fcolor(diffuse);
	w.w_fcolor(specular);
	w.w_fcolor(ambient);
	w.w_float(range);
	w.w_float(falloff);
	w.w_float(attenuation0);
	w.w_float(attenuation1);
	w.w_float(attenuation2);
	w.w_float(theta);
	w.w_float(phi);
}